

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagr_fe.h
# Opt level: O0

MatrixXd * __thiscall
lf::uscalfe::FeLagrangeO2Tria<double>::EvaluationNodes
          (MatrixXd *__return_storage_ptr__,FeLagrangeO2Tria<double> *this)

{
  CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_> *pCVar1;
  Scalar local_108;
  Scalar local_100;
  Scalar local_f8;
  Scalar local_f0;
  Scalar local_e8;
  Scalar local_e0;
  Scalar local_d8;
  Scalar local_d0;
  Scalar local_c8;
  Scalar local_c0 [3];
  Scalar local_a8;
  Scalar local_a0;
  CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_> local_98;
  DenseBase<Eigen::Matrix<double,_2,_6,_0,_2,_6>_> local_78 [8];
  Matrix<double,_2,_6,_0,_2,_6> nodes;
  FeLagrangeO2Tria<double> *this_local;
  
  nodes.super_PlainObjectBase<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>.m_storage.m_data.array[0xb] =
       (double)this;
  Eigen::Matrix<double,_2,_6,_0,_2,_6>::Matrix((Matrix<double,_2,_6,_0,_2,_6> *)local_78);
  local_a0 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator<<(&local_98,local_78,&local_a0);
  local_a8 = 1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (&local_98,&local_a8);
  local_c0[0] = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar1,local_c0);
  local_c8 = 0.5;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar1,&local_c8);
  local_d0 = 0.5;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar1,&local_d0);
  local_d8 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar1,&local_d8);
  local_e0 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar1,&local_e0);
  local_e8 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar1,&local_e8);
  local_f0 = 1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar1,&local_f0);
  local_f8 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar1,&local_f8);
  local_100 = 0.5;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar1,&local_100);
  local_108 = 0.5;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_(pCVar1,&local_108);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::~CommaInitializer(&local_98);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,2,6,0,2,6>>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,
             (EigenBase<Eigen::Matrix<double,_2,_6,_0,_2,_6>_> *)local_78);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] Eigen::MatrixXd EvaluationNodes() const override {
    // clang-format off
    Eigen::Matrix<double, 2,6> nodes;
    // Reference coordinates of evaluation nodes in the columns of a 2 x 6 - matrix. 
    nodes << 0.0, 1.0, 0.0,  0.5, 0.5, 0.0,
             0.0, 0.0, 1.0,  0.0, 0.5, 0.5;
    // clang-format on
    return nodes;
  }